

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_unsigned.cpp
# Opt level: O1

sc_unsigned * __thiscall sc_dt::sc_unsigned::operator=(sc_unsigned *this,long v)

{
  uint uVar1;
  sc_digit *psVar2;
  small_type sVar3;
  ulong uVar4;
  bool bVar5;
  
  sVar3 = 0;
  if (v < 1) {
    bVar5 = true;
    if (v != 0) {
      sVar3 = -1;
      v = -v;
      bVar5 = false;
    }
  }
  else {
    sVar3 = 1;
    bVar5 = false;
  }
  this->sgn = sVar3;
  uVar1 = this->ndigits;
  if (bVar5) {
    if (0 < (int)uVar1) {
      memset(this->digit,0,(ulong)(uVar1 - 1) * 4 + 4);
    }
  }
  else {
    psVar2 = this->digit;
    bVar5 = 0 < (int)uVar1;
    uVar4 = 0;
    if (0 < (int)uVar1 && v != 0) {
      uVar4 = 0;
      do {
        psVar2[uVar4] = (uint)v & 0x3fffffff;
        uVar4 = uVar4 + 1;
        bVar5 = uVar4 < uVar1;
        if ((ulong)v < 0x40000000) break;
        v = (ulong)v >> 0x1e;
      } while (uVar4 < uVar1);
    }
    if (bVar5) {
      memset(psVar2 + (uVar4 & 0xffffffff),0,(ulong)(~(uint)uVar4 + uVar1) * 4 + 4);
    }
    convert_SM_to_2C_to_SM(this);
  }
  return this;
}

Assistant:

const sc_unsigned&
sc_unsigned::operator=(long v)
{
  sgn = get_sign(v);
  if ( sgn == SC_ZERO ) {
    vec_zero(ndigits, digit);
  }
  else {
    from_uint(ndigits, digit, (unsigned long) v);
    convert_SM_to_2C_to_SM();
  }
  return *this;
}